

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::StringPieceToRune(Rune *r,StringPiece *sp,RegexpStatus *status)

{
  Rune *rune;
  int iVar1;
  const_pointer pcVar2;
  unsigned_long *puVar3;
  RegexpStatus *in_RDX;
  StringPiece *in_RSI;
  Rune *in_RDI;
  int n;
  StringPiece local_48;
  int local_34;
  size_type local_30;
  unsigned_long local_28;
  RegexpStatus *local_20;
  StringPiece *local_18;
  Rune *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = StringPiece::data(in_RSI);
  local_28 = 4;
  local_30 = StringPiece::size(local_18);
  puVar3 = std::min<unsigned_long>(&local_28,&local_30);
  iVar1 = fullrune(pcVar2,(int)*puVar3);
  rune = local_10;
  if (iVar1 != 0) {
    pcVar2 = StringPiece::data(local_18);
    local_34 = chartorune(rune,pcVar2);
    if (0x10ffff < *local_10) {
      local_34 = 1;
      *local_10 = 0xfffd;
    }
    if ((local_34 != 1) || (*local_10 != 0xfffd)) {
      StringPiece::remove_prefix(local_18,(long)local_34);
      return local_34;
    }
  }
  RegexpStatus::set_code(local_20,kRegexpBadUTF8);
  StringPiece::StringPiece(&local_48);
  RegexpStatus::set_error_arg(local_20,&local_48);
  return -1;
}

Assistant:

static int StringPieceToRune(Rune *r, StringPiece *sp, RegexpStatus* status) {
  // fullrune() takes int, not size_t. However, it just looks
  // at the leading byte and treats any length >= 4 the same.
  if (fullrune(sp->data(), static_cast<int>(std::min(size_t{4}, sp->size())))) {
    int n = chartorune(r, sp->data());
    // Some copies of chartorune have a bug that accepts
    // encodings of values in (10FFFF, 1FFFFF] as valid.
    // Those values break the character class algorithm,
    // which assumes Runemax is the largest rune.
    if (*r > Runemax) {
      n = 1;
      *r = Runeerror;
    }
    if (!(n == 1 && *r == Runeerror)) {  // no decoding error
      sp->remove_prefix(n);
      return n;
    }
  }

  status->set_code(kRegexpBadUTF8);
  status->set_error_arg(StringPiece());
  return -1;
}